

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O2

void __thiscall Oric::VideoOutput::run_for(VideoOutput *this,Cycles cycles)

{
  CRT *this_00;
  uint8_t **ppuVar1;
  InputDataType IVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  byte bVar5;
  uint uVar6;
  uint8_t *puVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  byte bVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  uint8_t colours [2];
  uint32_t colours_1 [2];
  
  this_00 = &this->crt_;
  ppuVar1 = &this->rgb_pixel_target_;
  do {
    iVar15 = SUB84(cycles.super_WrappedInt<Cycles>.length_,0);
    if (iVar15 == 0) {
      return;
    }
    uVar17 = this->counter_;
    iVar13 = iVar15;
    if ((int)uVar17 < this->v_sync_start_position_) {
LAB_0033d51a:
      uVar12 = uVar17 & 0x3f;
      if (uVar12 < 0x28 && (int)uVar17 < 0x3800) {
        if (uVar12 == 0) {
          this->ink_ = '\a';
          this->paper_ = '\0';
          this->blink_text_ = false;
          this->use_alternative_character_set_ = false;
          this->use_double_height_characters_ = false;
          iVar13 = 0xb400;
          if (this->is_graphics_mode_ != false) {
            iVar13 = 0x9800;
          }
          this->character_set_base_address_ = iVar13;
          IVar2 = this->data_type_;
          puVar7 = Outputs::CRT::CRT::begin_data(this_00,0xf0,1);
          *(uint8_t **)
           ((long)(&this->frequency_mismatch_warner_ + 1) +
           (ulong)(IVar2 != Red1Green1Blue1) * 8 + 0x18) = puVar7;
          uVar10 = this->counter_;
          uVar6 = this->frame_counter_;
          if (uVar10 == 0) {
            uVar6 = uVar6 + 1;
            this->frame_counter_ = uVar6;
            bVar21 = this->next_frame_is_sixty_hertz_ != false;
            iVar13 = 0x4000;
            if (bVar21) {
              iVar13 = 0x3a80;
            }
            this->v_sync_start_position_ = iVar13;
            iVar13 = 0x40c0;
            if (bVar21) {
              iVar13 = 0x3b80;
            }
            this->v_sync_end_position_ = iVar13;
            iVar13 = 0x4e00;
            if (bVar21) {
              iVar13 = 0x4180;
            }
            this->counter_period_ = iVar13;
            uVar10 = 0;
          }
        }
        else {
          uVar6 = this->frame_counter_;
          uVar10 = uVar17;
        }
        iVar13 = 0x28 - uVar12;
        if (iVar15 < (int)(0x28 - uVar12)) {
          iVar13 = iVar15;
        }
        bVar5 = ((uVar6 >> 5 & 1) != 0) - 1;
        if (this->blink_text_ == false) {
          bVar5 = 0xff;
        }
        uVar20 = (ulong)(uVar17 & 0x3f);
        lVar14 = (long)(int)-(uVar17 & 0x3f) + 0x28;
        if (iVar15 <= lVar14) {
          lVar14 = (long)iVar15;
        }
        for (lVar16 = 0; (int)lVar14 != (int)lVar16; lVar16 = lVar16 + 1) {
          puVar7 = this->ram_;
          if ((this->counter_ < 0x3200 & this->is_graphics_mode_) == 1) {
            bVar18 = puVar7[lVar16 + (long)(((int)uVar10 >> 6) * 0x28) + uVar20 + 0xa000];
            uVar17 = (uint)bVar18;
          }
          else {
            uVar17 = (uint)puVar7[lVar16 + (long)(((int)uVar10 >> 9) * 0x28) + uVar20 + 48000];
            bVar18 = puVar7[(int)((uVar17 & 0x7f) * 8 + this->character_set_base_address_ +
                                 ((uint)this->counter_ >>
                                  (this->use_double_height_characters_ & 0x1fU | 6) & 7))];
          }
          bVar8 = (byte)uVar17;
          bVar9 = (char)bVar8 >> 7 & 7;
          if ((uVar17 & 0x60) == 0) {
            switch(uVar17 & 0x1f) {
            case 0:
              this->ink_ = '\0';
              break;
            case 1:
              this->ink_ = '\x04';
              break;
            case 2:
              this->ink_ = '\x02';
              break;
            case 3:
              this->ink_ = '\x06';
              break;
            case 4:
              this->ink_ = '\x01';
              break;
            case 5:
              this->ink_ = '\x05';
              break;
            case 6:
              this->ink_ = '\x03';
              break;
            case 7:
              this->ink_ = '\a';
              break;
            default:
              this->use_alternative_character_set_ = (bool)(bVar8 & 1);
              this->use_double_height_characters_ = (bool)(bVar8 >> 1 & 1);
              this->blink_text_ = (bool)(bVar8 >> 2 & 1);
              iVar11 = (uVar17 & 1) * 0x400;
              iVar19 = iVar11 + 0xb400;
              if (this->is_graphics_mode_ != false) {
                iVar19 = iVar11 + 0x9800;
              }
              this->character_set_base_address_ = iVar19;
              break;
            case 0x10:
              this->paper_ = '\0';
              break;
            case 0x11:
              this->paper_ = '\x04';
              break;
            case 0x12:
              this->paper_ = '\x02';
              break;
            case 0x13:
              this->paper_ = '\x06';
              break;
            case 0x14:
              this->paper_ = '\x01';
              break;
            case 0x15:
              this->paper_ = '\x05';
              break;
            case 0x16:
              this->paper_ = '\x03';
              break;
            case 0x17:
              this->paper_ = '\a';
              break;
            case 0x18:
            case 0x19:
            case 0x1a:
            case 0x1b:
            case 0x1c:
            case 0x1d:
            case 0x1e:
            case 0x1f:
              this->is_graphics_mode_ = (bool)(bVar8 >> 2 & 1);
              this->next_frame_is_sixty_hertz_ = (uVar17 & 2) == 0;
            }
            if ((this->data_type_ == Red1Green1Blue1) && (*ppuVar1 != (uint8_t *)0x0)) {
              bVar9 = bVar9 ^ this->paper_;
              (*ppuVar1)[5] = bVar9;
              this->rgb_pixel_target_[4] = bVar9;
              this->rgb_pixel_target_[3] = bVar9;
              this->rgb_pixel_target_[2] = bVar9;
              this->rgb_pixel_target_[1] = bVar9;
              *this->rgb_pixel_target_ = bVar9;
            }
            else {
              puVar4 = this->composite_pixel_target_;
              if (puVar4 != (uint32_t *)0x0) {
                uVar3 = this->colour_forms_[bVar9 ^ this->paper_];
                puVar4[5] = uVar3;
                puVar4[4] = uVar3;
                *puVar4 = uVar3;
                puVar4[1] = uVar3;
                puVar4[2] = uVar3;
                puVar4[3] = uVar3;
              }
            }
          }
          else {
            bVar18 = bVar18 & bVar5;
            if ((this->data_type_ == Red1Green1Blue1) && (*ppuVar1 != (uint8_t *)0x0)) {
              colours[0] = this->paper_ ^ bVar9;
              colours[1] = bVar9 ^ this->ink_;
              **ppuVar1 = colours[(bVar18 >> 5 & 1) != 0];
              this->rgb_pixel_target_[1] = colours[(bVar18 >> 4 & 1) != 0];
              this->rgb_pixel_target_[2] = colours[(bVar18 >> 3 & 1) != 0];
              this->rgb_pixel_target_[3] = colours[(bVar18 >> 2 & 1) != 0];
              this->rgb_pixel_target_[4] = colours[(bVar18 >> 1 & 1) != 0];
              this->rgb_pixel_target_[5] = colours[bVar18 & 1];
            }
            else {
              puVar4 = this->composite_pixel_target_;
              if (puVar4 != (uint32_t *)0x0) {
                colours_1[0] = this->colour_forms_[this->paper_ ^ bVar9];
                colours_1[1] = this->colour_forms_[bVar9 ^ this->ink_];
                uVar17 = (uint)bVar18;
                *puVar4 = *(uint32_t *)((long)colours_1 + (ulong)(bVar18 >> 3 & 4));
                puVar4[1] = *(uint32_t *)((long)colours_1 + (ulong)(bVar18 >> 2 & 4));
                puVar4[2] = *(uint32_t *)((long)colours_1 + (ulong)(bVar18 >> 1 & 4));
                puVar4[3] = *(uint32_t *)((long)colours_1 + (ulong)(uVar17 & 4));
                puVar4[4] = *(uint32_t *)((long)colours_1 + (ulong)(uVar17 & 2) * 2);
                puVar4[5] = colours_1[uVar17 & 1];
              }
            }
          }
          if (*ppuVar1 != (uint8_t *)0x0) {
            *ppuVar1 = *ppuVar1 + 6;
          }
          if (this->composite_pixel_target_ != (uint32_t *)0x0) {
            this->composite_pixel_target_ = this->composite_pixel_target_ + 6;
          }
        }
        if (0x28 - uVar20 == lVar16) {
          Outputs::CRT::CRT::output_data(this_00,0xf0);
          this->rgb_pixel_target_ = (uint8_t *)0x0;
          this->composite_pixel_target_ = (uint32_t *)0x0;
        }
      }
      else if (uVar12 < 0x30) {
        if ((int)(0x30 - uVar12) <= iVar15) {
          iVar13 = 0x120;
          if ((int)uVar17 < 0x3800) {
            iVar13 = 0x30;
          }
          Outputs::CRT::CRT::output_blank(this_00,iVar13);
          iVar13 = 0x30 - uVar12;
        }
      }
      else if (uVar12 < 0x36) {
        if ((int)(0x36 - uVar12) <= iVar15) {
          Outputs::CRT::CRT::output_sync(this_00,0x24);
          iVar13 = 0x36 - uVar12;
        }
      }
      else if (uVar12 < 0x38) {
        if ((int)(0x38 - uVar12) <= iVar15) {
          Outputs::CRT::CRT::output_default_colour_burst(this_00,0xc,')');
          iVar13 = 0x38 - uVar12;
        }
      }
      else if ((int)(0x40 - uVar12) <= iVar15) {
        Outputs::CRT::CRT::output_blank(this_00,0x30);
        iVar13 = 0x40 - uVar12;
      }
    }
    else {
      iVar19 = this->v_sync_end_position_;
      iVar11 = iVar19 - uVar17;
      if (iVar11 == 0 || iVar19 < (int)uVar17) goto LAB_0033d51a;
      if (iVar11 <= iVar15) {
        Outputs::CRT::CRT::output_sync(this_00,(iVar19 - this->v_sync_start_position_) * 6);
        iVar13 = iVar11;
      }
    }
    this->counter_ = (this->counter_ + iVar13) % this->counter_period_;
    cycles.super_WrappedInt<Cycles>.length_ = (WrappedInt<Cycles>)(ulong)(uint)(iVar15 - iVar13);
  } while( true );
}

Assistant:

void VideoOutput::run_for(const Cycles cycles) {
	// Horizontal: 0-39: pixels; otherwise blank; 48-53 sync, 54-56 colour burst.
	// Vertical: 0-223: pixels; otherwise blank; 256-259 (50Hz) or 234-238 (60Hz) sync.

#define clamp(action)	\
	if(cycles_run_for <= number_of_cycles) { action; } else cycles_run_for = number_of_cycles;

	int number_of_cycles = int(cycles.as_integral());
	while(number_of_cycles) {
		int h_counter = counter_ & 63;
		int cycles_run_for = 0;

		if(counter_ >= v_sync_start_position_ && counter_ < v_sync_end_position_) {
			// this is a sync line
			cycles_run_for = v_sync_end_position_ - counter_;
			clamp(crt_.output_sync((v_sync_end_position_ - v_sync_start_position_) * 6));
		} else if(counter_ < 224*64 && h_counter < 40) {
			// this is a pixel line
			if(!h_counter) {
				ink_ = 0x7;
				paper_ = 0x0;
				use_alternative_character_set_ = use_double_height_characters_ = blink_text_ = false;
				set_character_set_base_address();

				if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1) {
					rgb_pixel_target_ = reinterpret_cast<uint8_t *>(crt_.begin_data(240));
				} else {
					composite_pixel_target_ = reinterpret_cast<uint32_t *>(crt_.begin_data(240));
				}

				if(!counter_) {
					frame_counter_++;

					v_sync_start_position_ = next_frame_is_sixty_hertz_ ? PAL60VSyncStartPosition : PAL50VSyncStartPosition;
					v_sync_end_position_ = next_frame_is_sixty_hertz_ ? PAL60VSyncEndPosition : PAL50VSyncEndPosition;
					counter_period_ = next_frame_is_sixty_hertz_ ? PAL60Period : PAL50Period;
				}
			}

			cycles_run_for = std::min(40 - h_counter, number_of_cycles);
			int columns = cycles_run_for;
			int pixel_base_address = 0xa000 + (counter_ >> 6) * 40;
			int character_base_address = 0xbb80 + (counter_ >> 9) * 40;
			const uint8_t blink_mask = (blink_text_ && (frame_counter_&32)) ? 0x00 : 0xff;

			while(columns--) {
				uint8_t pixels, control_byte;

				if(is_graphics_mode_ && counter_ < 200*64) {
					control_byte = pixels = ram_[pixel_base_address + h_counter];
				} else {
					int address = character_base_address + h_counter;
					control_byte = ram_[address];
					const int line = use_double_height_characters_ ? ((counter_ >> 7) & 7) : ((counter_ >> 6) & 7);
					pixels = ram_[character_set_base_address_ + (control_byte&127) * 8 + line];
				}

				const uint8_t inverse_mask = (control_byte & 0x80) ? 0x7 : 0x0;
				pixels &= blink_mask;

				if(control_byte & 0x60) {
					if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1 && rgb_pixel_target_) {
						const uint8_t colours[2] = {
							uint8_t(paper_ ^ inverse_mask),
							uint8_t(ink_ ^ inverse_mask)
						};
						rgb_pixel_target_[0] = colours[(pixels >> 5)&1];
						rgb_pixel_target_[1] = colours[(pixels >> 4)&1];
						rgb_pixel_target_[2] = colours[(pixels >> 3)&1];
						rgb_pixel_target_[3] = colours[(pixels >> 2)&1];
						rgb_pixel_target_[4] = colours[(pixels >> 1)&1];
						rgb_pixel_target_[5] = colours[(pixels >> 0)&1];
					} else if(composite_pixel_target_) {
						const uint32_t colours[2] = {
							colour_forms_[paper_ ^ inverse_mask],
							colour_forms_[ink_ ^ inverse_mask]
						};
						composite_pixel_target_[0] = colours[(pixels >> 5)&1];
						composite_pixel_target_[1] = colours[(pixels >> 4)&1];
						composite_pixel_target_[2] = colours[(pixels >> 3)&1];
						composite_pixel_target_[3] = colours[(pixels >> 2)&1];
						composite_pixel_target_[4] = colours[(pixels >> 1)&1];
						composite_pixel_target_[5] = colours[(pixels >> 0)&1];
					}
				} else {
					switch(control_byte & 0x1f) {
						case 0x00:		ink_ = 0x0;	break;
						case 0x01:		ink_ = 0x4;	break;
						case 0x02:		ink_ = 0x2;	break;
						case 0x03:		ink_ = 0x6;	break;
						case 0x04:		ink_ = 0x1;	break;
						case 0x05:		ink_ = 0x5;	break;
						case 0x06:		ink_ = 0x3;	break;
						case 0x07:		ink_ = 0x7;	break;

						case 0x08:	case 0x09:	case 0x0a: case 0x0b:
						case 0x0c:	case 0x0d:	case 0x0e: case 0x0f:
							use_alternative_character_set_ = (control_byte&1);
							use_double_height_characters_ = (control_byte&2);
							blink_text_ = (control_byte&4);
							set_character_set_base_address();
						break;

						case 0x10:		paper_ = 0x0;	break;
						case 0x11:		paper_ = 0x4;	break;
						case 0x12:		paper_ = 0x2;	break;
						case 0x13:		paper_ = 0x6;	break;
						case 0x14:		paper_ = 0x1;	break;
						case 0x15:		paper_ = 0x5;	break;
						case 0x16:		paper_ = 0x3;	break;
						case 0x17:		paper_ = 0x7;	break;

						case 0x18: case 0x19: case 0x1a: case 0x1b:
						case 0x1c: case 0x1d: case 0x1e: case 0x1f:
							is_graphics_mode_ = (control_byte & 4);
							next_frame_is_sixty_hertz_ = !(control_byte & 2);
						break;

						default: break;
					}

					if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1 && rgb_pixel_target_) {
						rgb_pixel_target_[0] = rgb_pixel_target_[1] =
						rgb_pixel_target_[2] = rgb_pixel_target_[3] =
						rgb_pixel_target_[4] = rgb_pixel_target_[5] = paper_ ^ inverse_mask;
					} else if(composite_pixel_target_) {
						composite_pixel_target_[0] = composite_pixel_target_[1] =
						composite_pixel_target_[2] = composite_pixel_target_[3] =
						composite_pixel_target_[4] = composite_pixel_target_[5] = colour_forms_[paper_ ^ inverse_mask];
					}
				}
				if(rgb_pixel_target_) rgb_pixel_target_ += 6;
				if(composite_pixel_target_) composite_pixel_target_ += 6;
				h_counter++;
			}

			if(h_counter == 40) {
				crt_.output_data(40 * 6);
				rgb_pixel_target_ = nullptr;
				composite_pixel_target_ = nullptr;
			}
		} else {
			// this is a blank line (or the equivalent part of a pixel line)
			if(h_counter < 48) {
				cycles_run_for = 48 - h_counter;
				clamp(
					int period = (counter_ < 224*64) ? 8 : 48;
					crt_.output_blank(period * 6);
				);
			} else if(h_counter < 54) {
				cycles_run_for = 54 - h_counter;
				clamp(crt_.output_sync(6 * 6));
			} else if(h_counter < 56) {
				cycles_run_for = 56 - h_counter;
				clamp(crt_.output_default_colour_burst(2 * 6));
			} else {
				cycles_run_for = 64 - h_counter;
				clamp(crt_.output_blank(8 * 6));
			}
		}

		counter_ = (counter_ + cycles_run_for)%counter_period_;
		number_of_cycles -= cycles_run_for;
	}
}